

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::TestPipelineImpl::getAnyCap(TestPipelineImpl *this,GetAnyCapContext context)

{
  SegmentBuilder *pSVar1;
  CapTableBuilder *pCVar2;
  CapTableBuilder *pCVar3;
  void *pvVar4;
  WirePointer *pWVar5;
  undefined8 uVar6;
  Disposer *pDVar7;
  RequestHook *pRVar8;
  TransformPromiseNodeBase *this_00;
  int iVar9;
  CapTableReader *__n;
  Disposer *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  PromiseNode *extraout_RDX_01;
  int in_R8D;
  bool bVar10;
  Promise<void> PVar11;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  Reader params;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_100;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_c8;
  StructReader local_88;
  CapTableReader *local_58;
  long *plStack_50;
  Maybe<capnp::MessageSize> local_48;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  (**in_RDX->_vptr_Disposer)(&local_100);
  local_c8.super_Builder._builder.data = local_100.super_Builder._builder.data;
  local_c8.super_Builder._builder.pointers = local_100.super_Builder._builder.pointers;
  local_c8.super_Builder._builder.segment = local_100.super_Builder._builder.segment;
  local_c8.super_Builder._builder.capTable = local_100.super_Builder._builder.capTable;
  PointerReader::getStruct(&local_88,(PointerReader *)&local_c8,(word *)0x0);
  bVar10 = true;
  if (0x1f < local_88.dataSize) {
    bVar10 = *local_88.data != 0xea;
  }
  if ((bVar10) && (kj::_::Debug::minSeverity < 3)) {
    iVar9 = 0;
    local_c8.super_Builder._builder.segment =
         (SegmentBuilder *)CONCAT44(local_c8.super_Builder._builder.segment._4_4_,0xea);
    if (0x1f < local_88.dataSize) {
      iVar9 = *local_88.data;
    }
    local_100.super_Builder._builder.segment =
         (SegmentBuilder *)CONCAT44(local_100.super_Builder._builder.segment._4_4_,iVar9);
    in_R8D = 0x5074cc;
    kj::_::Debug::log<char_const(&)[42],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x3bf,ERROR,"\"failed: expected \" \"(234) == (params.getN())\", 234, params.getN()"
               ,(char (*) [42])"failed: expected (234) == (params.getN())",(int *)&local_c8,
               (uint *)&local_100);
  }
  __n = local_88.capTable;
  if (local_88.pointerCount == 0) {
    local_88.nestingLimit = 0x7fffffff;
    local_88.pointers = (WirePointer *)0x0;
    local_88.segment = (SegmentReader *)0x0;
    __n = (CapTableReader *)0x0;
  }
  local_c8.super_Builder._builder.pointers =
       (WirePointer *)CONCAT44(local_c8.super_Builder._builder.pointers._4_4_,local_88.nestingLimit)
  ;
  local_c8.super_Builder._builder.segment = (SegmentBuilder *)local_88.segment;
  local_c8.super_Builder._builder.capTable = (CapTableBuilder *)__n;
  local_c8.super_Builder._builder.data = local_88.pointers;
  PointerReader::getCapability((PointerReader *)&local_100);
  pCVar2 = local_100.super_Builder._builder.capTable;
  pSVar1 = local_100.super_Builder._builder.segment;
  (*in_RDX->_vptr_Disposer[1])();
  (*((local_100.super_Builder._builder.capTable)->super_CapTableReader)._vptr_CapTableReader[4])
            (&local_58,local_100.super_Builder._builder.capTable);
  local_100.super_Builder._builder.capTable = (CapTableBuilder *)local_58;
  local_100.super_Builder._builder.data = plStack_50;
  local_100.super_Builder._builder.segment = (SegmentBuilder *)&Capability::Client::typeinfo;
  local_48.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            (&local_c8,(Client *)&local_100,&local_48);
  pvVar4 = local_100.super_Builder._builder.data;
  __buf = extraout_RDX;
  if ((long *)local_100.super_Builder._builder.data != (long *)0x0) {
    local_100.super_Builder._builder.data = (long *)0x0;
    (**((local_100.super_Builder._builder.capTable)->super_CapTableReader)._vptr_CapTableReader)
              (local_100.super_Builder._builder.capTable,(long)pvVar4 + *(long *)(*pvVar4 + -0x10));
    __buf = extraout_RDX_00;
  }
  ((WireValue<uint32_t>_conflict *)local_c8.super_Builder._builder.data)->value = 0x7b;
  *(byte *)((long)local_c8.super_Builder._builder.data + 4) =
       *(byte *)((long)local_c8.super_Builder._builder.data + 4) | 1;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_100,(int)&local_c8,__buf,(size_t)__n,in_R8D);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x38);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)&local_100,
             kj::_::
             TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++:969:7),_kj::_::PropagateException>
             ::anon_class_16_2_06e2585c_for_func::operator());
  pDVar7 = local_100.hook.disposer;
  uVar6 = local_100.super_Builder._builder._32_8_;
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00635c50;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)context.hook;
  this_00[1].dependency.disposer = in_RDX;
  (this->super_Server)._vptr_Server =
       (_func_int **)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,capnp::_::TestPipelineImpl::getAnyCap(capnp::CallContext<capnproto_test::capnp::test::TestPipeline::GetAnyCapParams,capnproto_test::capnp::test::TestPipeline::GetAnyCapResults>)::$_0,kj::_::PropagateException>>
        ::instance;
  *(TransformPromiseNodeBase **)&(this->super_Server).field_0x8 = this_00;
  if (local_100.super_Builder._builder._32_8_ != 0) {
    local_100.super_Builder._builder.dataSize = 0;
    local_100.super_Builder._builder.pointerCount = 0;
    local_100.super_Builder._builder._38_2_ = 0;
    local_100.hook.disposer = (Disposer *)0x0;
    (**(local_100.hook.ptr)->_vptr_RequestHook)(local_100.hook.ptr,uVar6,8,pDVar7,pDVar7,0);
  }
  pWVar5 = local_100.super_Builder._builder.pointers;
  if (local_100.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_100.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_100.super_Builder._builder.data)
              (local_100.super_Builder._builder.data,
               (long)&(pWVar5->offsetAndKind).value + *(long *)((long)*pWVar5 + -0x10));
  }
  pCVar3 = local_100.super_Builder._builder.capTable;
  if (&(local_100.super_Builder._builder.capTable)->super_CapTableReader != (CapTableReader *)0x0) {
    local_100.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (**(code **)((local_100.super_Builder._builder.segment)->super_SegmentReader).arena)
              (local_100.super_Builder._builder.segment,
               (pCVar3->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&pCVar3->super_CapTableReader);
  }
  pRVar8 = local_c8.hook.ptr;
  if (local_c8.hook.ptr != (RequestHook *)0x0) {
    local_c8.hook.ptr = (RequestHook *)0x0;
    (**(local_c8.hook.disposer)->_vptr_Disposer)
              (local_c8.hook.disposer,
               pRVar8->_vptr_RequestHook[-2] + (long)&pRVar8->_vptr_RequestHook);
  }
  (*(code *)((pSVar1->super_SegmentReader).arena)->_vptr_Arena)
            (pSVar1,(pCVar2->super_CapTableReader)._vptr_CapTableReader[-2] +
                    (long)&pCVar2->super_CapTableReader);
  PVar11.super_PromiseBase.node.ptr = extraout_RDX_01;
  PVar11.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar11.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestPipelineImpl::getAnyCap(GetAnyCapContext context) {
  ++callCount;

  auto params = context.getParams();
  EXPECT_EQ(234, params.getN());

  auto cap = params.getInCap();
  context.releaseParams();

  auto request = cap.castAs<test::TestInterface>().fooRequest();
  request.setI(123);
  request.setJ(true);

  return request.send().then(
      [this,KJ_CPCAP(context)](Response<test::TestInterface::FooResults>&& response) mutable {
        EXPECT_EQ("foo", response.getX());

        auto result = context.getResults();
        result.setS("bar");
        result.initOutBox().setCap(kj::heap<TestExtendsImpl>(callCount));
      }